

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

void enet_peer_dispatch_incoming_reliable_commands
               (ENetPeer *peer,ENetChannel *channel,ENetIncomingCommand *queuedCommand)

{
  ENetList *excludeCommand;
  ushort uVar1;
  ushort uVar2;
  uint16_t uVar3;
  _ENetListNode *p_Var4;
  _ENetListNode *p_Var5;
  _ENetHost *p_Var6;
  ushort uVar7;
  _ENetListNode *p_Var8;
  ENetIncomingCommand *incomingCommand;
  ENetListIterator first;
  ENetListIterator pEVar9;
  ENetListIterator pEVar10;
  int iVar11;
  ushort uVar12;
  bool bVar13;
  
  for (p_Var8 = (channel->incomingReliableCommands).sentinel.next;
      ((p_Var8 != &(channel->incomingReliableCommands).sentinel &&
       (*(int *)&p_Var8[4].previous == 0)) &&
      (uVar3 = *(uint16_t *)&p_Var8[1].next,
      uVar3 == (uint16_t)(channel->incomingReliableSequenceNumber + 1))); p_Var8 = p_Var8->next) {
    channel->incomingReliableSequenceNumber = uVar3;
    iVar11 = *(int *)((long)&p_Var8[4].next + 4);
    if (iVar11 != 0) {
      channel->incomingReliableSequenceNumber = (uVar3 + (short)iVar11) - 1;
    }
  }
  p_Var4 = (channel->incomingReliableCommands).sentinel.next;
  if (p_Var8 != p_Var4) {
    channel->incomingUnreliableSequenceNumber = 0;
    p_Var8 = p_Var8->previous;
    p_Var5 = p_Var4->previous;
    p_Var5->next = p_Var8->next;
    p_Var8->next->previous = p_Var5;
    p_Var5 = (peer->dispatchedCommands).sentinel.previous;
    p_Var4->previous = p_Var5;
    p_Var8->next = &(peer->dispatchedCommands).sentinel;
    p_Var5->next = p_Var4;
    (peer->dispatchedCommands).sentinel.previous = p_Var8;
    if (peer->needsDispatch == 0) {
      p_Var6 = peer->host;
      p_Var8 = (p_Var6->dispatchQueue).sentinel.previous;
      (peer->dispatchList).previous = p_Var8;
      (peer->dispatchList).next = &(p_Var6->dispatchQueue).sentinel;
      p_Var8->next = &peer->dispatchList;
      (p_Var6->dispatchQueue).sentinel.previous = &peer->dispatchList;
      peer->needsDispatch = 1;
    }
    if ((channel->incomingUnreliableCommands).sentinel.next !=
        &(channel->incomingUnreliableCommands).sentinel) {
      excludeCommand = &channel->incomingUnreliableCommands;
      p_Var8 = (channel->incomingUnreliableCommands).sentinel.next;
      pEVar9 = p_Var8;
      pEVar10 = p_Var8;
      if (p_Var8 != &excludeCommand->sentinel) {
        do {
          iVar11 = 4;
          if (((ulong)pEVar9[1].next & 0xf00000000) != 0x900000000) {
            uVar1 = *(ushort *)&pEVar9[1].next;
            uVar2 = channel->incomingReliableSequenceNumber;
            if (uVar1 == uVar2) {
              if (*(int *)&pEVar9[4].previous == 0) {
                channel->incomingUnreliableSequenceNumber = *(uint16_t *)((long)&pEVar9[1].next + 2)
                ;
              }
              else {
                if (pEVar10 == pEVar9) {
                  if (p_Var8 != pEVar9) {
                    p_Var8 = pEVar9->previous;
                  }
                }
                else {
                  p_Var8 = pEVar9->previous;
                  p_Var4 = pEVar10->previous;
                  p_Var4->next = p_Var8->next;
                  p_Var8->next->previous = p_Var4;
                  p_Var4 = (peer->dispatchedCommands).sentinel.previous;
                  pEVar10->previous = p_Var4;
                  p_Var8->next = &(peer->dispatchedCommands).sentinel;
                  p_Var4->next = pEVar10;
                  (peer->dispatchedCommands).sentinel.previous = p_Var8;
                  p_Var8 = pEVar9;
                  if (peer->needsDispatch == 0) {
                    p_Var6 = peer->host;
                    p_Var4 = (p_Var6->dispatchQueue).sentinel.previous;
                    (peer->dispatchList).previous = p_Var4;
                    (peer->dispatchList).next = &(p_Var6->dispatchQueue).sentinel;
                    p_Var4->next = &peer->dispatchList;
                    (p_Var6->dispatchQueue).sentinel.previous = &peer->dispatchList;
                    peer->needsDispatch = 1;
                  }
                }
LAB_00106675:
                pEVar10 = pEVar9->next;
                iVar11 = 0;
              }
            }
            else {
              uVar7 = uVar2 >> 0xc;
              uVar12 = (uVar1 >> 0xc) + 0x10;
              if (uVar2 <= uVar1) {
                uVar12 = uVar1 >> 0xc;
              }
              bVar13 = (ushort)(uVar7 + 7) <= uVar12;
              iVar11 = 2;
              if (bVar13 || uVar12 < uVar7) {
                p_Var8 = pEVar9->next;
                iVar11 = 0;
                if (pEVar10 != pEVar9) {
                  p_Var4 = pEVar9->previous;
                  p_Var5 = pEVar10->previous;
                  p_Var5->next = p_Var4->next;
                  p_Var4->next->previous = p_Var5;
                  p_Var5 = (peer->dispatchedCommands).sentinel.previous;
                  pEVar10->previous = p_Var5;
                  p_Var4->next = &(peer->dispatchedCommands).sentinel;
                  p_Var5->next = pEVar10;
                  (peer->dispatchedCommands).sentinel.previous = p_Var4;
                  if (peer->needsDispatch == 0) {
                    p_Var6 = peer->host;
                    p_Var4 = (p_Var6->dispatchQueue).sentinel.previous;
                    (peer->dispatchList).previous = p_Var4;
                    (peer->dispatchList).next = &(p_Var6->dispatchQueue).sentinel;
                    p_Var4->next = &peer->dispatchList;
                    (p_Var6->dispatchQueue).sentinel.previous = &peer->dispatchList;
                    peer->needsDispatch = 1;
                  }
                }
              }
              if (bVar13 || uVar12 < uVar7) goto LAB_00106675;
            }
          }
        } while ((iVar11 != 2) && (pEVar9 = pEVar9->next, pEVar9 != &excludeCommand->sentinel));
      }
      if (pEVar10 != pEVar9) {
        p_Var8 = pEVar9->previous;
        p_Var4 = pEVar10->previous;
        p_Var4->next = p_Var8->next;
        p_Var8->next->previous = p_Var4;
        p_Var4 = (peer->dispatchedCommands).sentinel.previous;
        pEVar10->previous = p_Var4;
        p_Var8->next = &(peer->dispatchedCommands).sentinel;
        p_Var4->next = pEVar10;
        (peer->dispatchedCommands).sentinel.previous = p_Var8;
        p_Var8 = pEVar9;
        if (peer->needsDispatch == 0) {
          p_Var6 = peer->host;
          p_Var4 = (p_Var6->dispatchQueue).sentinel.previous;
          (peer->dispatchList).previous = p_Var4;
          (peer->dispatchList).next = &(p_Var6->dispatchQueue).sentinel;
          p_Var4->next = &peer->dispatchList;
          (p_Var6->dispatchQueue).sentinel.previous = &peer->dispatchList;
          peer->needsDispatch = 1;
        }
      }
      enet_peer_remove_incoming_commands
                ((ENetList *)(excludeCommand->sentinel).next,p_Var8,
                 &queuedCommand->incomingCommandList,(ENetIncomingCommand *)excludeCommand);
      return;
    }
  }
  return;
}

Assistant:

void enet_peer_dispatch_incoming_reliable_commands(ENetPeer* peer, ENetChannel* channel, ENetIncomingCommand* queuedCommand) {
	ENetListIterator currentCommand;

	for (currentCommand = enet_list_begin(&channel->incomingReliableCommands); currentCommand != enet_list_end(&channel->incomingReliableCommands); currentCommand = enet_list_next(currentCommand)) {
		ENetIncomingCommand* incomingCommand = (ENetIncomingCommand*)currentCommand;

		if (incomingCommand->fragmentsRemaining > 0 || incomingCommand->reliableSequenceNumber != (uint16_t)(channel->incomingReliableSequenceNumber + 1))
			break;

		channel->incomingReliableSequenceNumber = incomingCommand->reliableSequenceNumber;

		if (incomingCommand->fragmentCount > 0)
			channel->incomingReliableSequenceNumber += incomingCommand->fragmentCount - 1;
	}

	if (currentCommand == enet_list_begin(&channel->incomingReliableCommands))
		return;

	channel->incomingUnreliableSequenceNumber = 0;

	enet_list_move(enet_list_end(&peer->dispatchedCommands), enet_list_begin(&channel->incomingReliableCommands), enet_list_previous(currentCommand));

	if (!peer->needsDispatch) {
		enet_list_insert(enet_list_end(&peer->host->dispatchQueue), &peer->dispatchList);

		peer->needsDispatch = 1;
	}

	if (!enet_list_empty(&channel->incomingUnreliableCommands))
		enet_peer_dispatch_incoming_unreliable_commands(peer, channel, queuedCommand);
}